

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

IPStatsRecord * __thiscall IPStatsRecord::CreateCopy(IPStatsRecord *this)

{
  size_t __n;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  IPStatsRecord *this_00;
  long lVar8;
  
  this_00 = (IPStatsRecord *)operator_new(0x368);
  IPStatsRecord(this_00);
  __n = this->ipaddr_length;
  this_00->ipaddr_length = __n;
  this_00->query_volume = this->query_volume;
  this_00->arpa_count = this->arpa_count;
  this_00->no_such_domain_queries = this->no_such_domain_queries;
  this_00->no_such_domain_reserved = this->no_such_domain_reserved;
  this_00->no_such_domain_frequent = this->no_such_domain_frequent;
  this_00->no_such_domain_chromioids = this->no_such_domain_chromioids;
  memcpy(this_00->ip_addr,this->ip_addr,__n);
  memcpy(this_00->hourly_volume,this->hourly_volume,0xc0);
  memcpy(this_00->daily_volume,this->daily_volume,0xf8);
  uVar1 = this->tld_counts[1];
  uVar2 = this->tld_counts[2];
  uVar3 = this->tld_counts[3];
  uVar4 = this->tld_counts[4];
  uVar5 = this->tld_counts[5];
  uVar6 = this->tld_counts[6];
  uVar7 = this->tld_counts[7];
  this_00->tld_counts[0] = this->tld_counts[0];
  this_00->tld_counts[1] = uVar1;
  this_00->tld_counts[2] = uVar2;
  this_00->tld_counts[3] = uVar3;
  this_00->tld_counts[4] = uVar4;
  this_00->tld_counts[5] = uVar5;
  this_00->tld_counts[6] = uVar6;
  this_00->tld_counts[7] = uVar7;
  lVar8 = 0x240;
  do {
    if (this_00->ip_addr[lVar8 + -8] < this->ip_addr[lVar8 + -8]) {
      this_00->ip_addr[lVar8 + -8] = this->ip_addr[lVar8 + -8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x250);
  uVar1 = this->sld_counts[0];
  uVar2 = this->sld_counts[1];
  uVar3 = this->sld_counts[2];
  uVar4 = this->sld_counts[3];
  uVar5 = this->sld_counts[4];
  uVar6 = this->sld_counts[5];
  uVar7 = this->sld_counts[7];
  this_00->sld_counts[6] = this->sld_counts[6];
  this_00->sld_counts[7] = uVar7;
  this_00->sld_counts[4] = uVar5;
  this_00->sld_counts[5] = uVar6;
  this_00->sld_counts[2] = uVar3;
  this_00->sld_counts[3] = uVar4;
  this_00->sld_counts[0] = uVar1;
  this_00->sld_counts[1] = uVar2;
  lVar8 = 0x290;
  do {
    if (this_00->ip_addr[lVar8 + -8] < this->ip_addr[lVar8 + -8]) {
      this_00->ip_addr[lVar8 + -8] = this->ip_addr[lVar8 + -8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x2a0);
  uVar1 = this->name_parts[0];
  uVar2 = this->name_parts[1];
  uVar3 = this->name_parts[2];
  uVar4 = this->name_parts[3];
  uVar5 = this->name_parts[4];
  uVar6 = this->name_parts[5];
  uVar7 = this->name_parts[7];
  this_00->name_parts[6] = this->name_parts[6];
  this_00->name_parts[7] = uVar7;
  this_00->name_parts[4] = uVar5;
  this_00->name_parts[5] = uVar6;
  this_00->name_parts[2] = uVar3;
  this_00->name_parts[3] = uVar4;
  this_00->name_parts[0] = uVar1;
  this_00->name_parts[1] = uVar2;
  uVar1 = this->rr_types[1];
  uVar2 = this->rr_types[2];
  uVar3 = this->rr_types[3];
  uVar4 = this->rr_types[4];
  uVar5 = this->rr_types[5];
  uVar6 = this->rr_types[6];
  uVar7 = this->rr_types[7];
  this_00->rr_types[0] = this->rr_types[0];
  this_00->rr_types[1] = uVar1;
  this_00->rr_types[2] = uVar2;
  this_00->rr_types[3] = uVar3;
  this_00->rr_types[4] = uVar4;
  this_00->rr_types[5] = uVar5;
  this_00->rr_types[6] = uVar6;
  this_00->rr_types[7] = uVar7;
  uVar1 = this->locales[1];
  uVar2 = this->locales[2];
  uVar3 = this->locales[3];
  uVar4 = this->locales[4];
  uVar5 = this->locales[5];
  uVar6 = this->locales[6];
  uVar7 = this->locales[7];
  this_00->locales[0] = this->locales[0];
  this_00->locales[1] = uVar1;
  this_00->locales[2] = uVar2;
  this_00->locales[3] = uVar3;
  this_00->locales[4] = uVar4;
  this_00->locales[5] = uVar5;
  this_00->locales[6] = uVar6;
  this_00->locales[7] = uVar7;
  return this_00;
}

Assistant:

IPStatsRecord* IPStatsRecord::CreateCopy()
{
    IPStatsRecord * isr = new IPStatsRecord();

    if (isr != NULL) {
        isr->ipaddr_length = ipaddr_length;
        isr->query_volume = query_volume;
        isr->arpa_count = arpa_count;
        isr->no_such_domain_queries = no_such_domain_queries;
        isr->no_such_domain_reserved = no_such_domain_reserved;
        isr->no_such_domain_frequent = no_such_domain_frequent;
        isr->no_such_domain_chromioids = no_such_domain_chromioids;

        memcpy(isr->ip_addr, ip_addr, ipaddr_length);
        memcpy(isr->hourly_volume, hourly_volume, sizeof(hourly_volume));
        memcpy(isr->daily_volume, daily_volume, sizeof(daily_volume));
        memcpy(isr->tld_counts, tld_counts, sizeof(tld_counts));
        isr->tld_hyperlog.AddLogs(&tld_hyperlog);
        memcpy(isr->sld_counts, sld_counts, sizeof(sld_counts));
        isr->sld_hyperlog.AddLogs(&sld_hyperlog);
        memcpy(isr->name_parts, name_parts, sizeof(name_parts));
        memcpy(isr->rr_types, rr_types, sizeof(rr_types));
        memcpy(isr->locales, locales, sizeof(locales));
    }
    return isr;
}